

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

void train(svm_params *params)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  svm_example *psVar3;
  svm_model *model;
  vw *pvVar4;
  svm_model *psVar5;
  svm_example **ppsVar6;
  float *pfVar7;
  svm_example *this;
  char cVar8;
  bool bVar9;
  uint uVar10;
  _Self __tmp;
  bool *train_pool;
  ulong uVar11;
  float *scores;
  _Base_ptr p_Var12;
  double *subopt;
  ulong uVar13;
  long *plVar14;
  size_t sVar15;
  long lVar16;
  vw_ostream *pvVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  scoremap;
  pair<const_double,_const_unsigned_long> local_70;
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  local_60;
  long lVar17;
  
  train_pool = calloc_or_throw<bool>(params->pool_size);
  if (params->pool_size != 0) {
    uVar11 = 0;
    do {
      train_pool[uVar11] = false;
      uVar11 = uVar11 + 1;
    } while (uVar11 < params->pool_size);
  }
  scores = calloc_or_throw<float>(params->pool_pos);
  predict(params,params->pool,scores,params->pool_pos);
  if (params->active != false) {
    if (params->active_pool_greedy == false) {
      if (params->pool_pos != 0) {
        uVar11 = 0;
        do {
          fVar22 = scores[uVar11];
          dVar2 = params->active_c;
          sVar21 = (params->pool[uVar11]->ex).example_counter;
          dVar23 = ((double)CONCAT44(0x45300000,(int)(sVar21 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar21) - 4503599627370496.0);
          if (dVar23 < 0.0) {
            dVar23 = sqrt(dVar23);
          }
          else {
            dVar23 = SQRT(dVar23);
          }
          fVar22 = expf(ABS((float)dVar23) * (float)((double)ABS(fVar22) * dVar2));
          fVar24 = 2.0 / (fVar22 + 1.0);
          fVar22 = merand48(&params->all->random_state);
          if (fVar22 < fVar24) {
            (params->pool[uVar11]->ex).l.simple.weight =
                 (1.0 / fVar24) * (params->pool[uVar11]->ex).l.simple.weight;
            train_pool[uVar11] = true;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < params->pool_pos);
      }
    }
    else {
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (params->pool_pos != 0) {
        uVar11 = 0;
        do {
          local_70.first = (double)ABS(scores[uVar11]);
          local_70.second = uVar11;
          std::
          _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
          ::_M_emplace_equal<std::pair<double_const,unsigned_long_const>>
                    ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                      *)&local_60,&local_70);
          uVar11 = uVar11 + 1;
        } while (uVar11 < params->pool_pos);
      }
      if (((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) &&
         (params->subsample != 0)) {
        p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar11 = 2;
        do {
          train_pool[(long)p_Var12[1]._M_parent] = true;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          if ((_Rb_tree_header *)p_Var12 == p_Var1) break;
          bVar9 = uVar11 <= params->subsample;
          uVar11 = uVar11 + 1;
        } while (bVar9);
      }
      std::
      _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
      ::~_Rb_tree(&local_60);
    }
  }
  if (params->para_active == true) {
    if (params->pool_pos != 0) {
      uVar11 = 0;
      do {
        if ((train_pool[uVar11] == false) &&
           (psVar3 = params->pool[uVar11], psVar3 != (svm_example *)0x0)) {
          svm_example::~svm_example(psVar3);
          operator_delete(psVar3);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < params->pool_pos);
    }
    sync_queries(params->all,params,train_pool);
  }
  if (params->all->training == false) {
    if (params->pool_pos != 0) {
      uVar11 = 0;
      do {
        psVar3 = params->pool[uVar11];
        if (psVar3 != (svm_example *)0x0) {
          svm_example::~svm_example(psVar3);
          operator_delete(psVar3);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < params->pool_pos);
    }
  }
  else if (params->pool_pos != 0) {
    model = params->model;
    uVar11 = 0;
    do {
      if ((params->active != true) || (uVar10 = 0xffffffff, train_pool[uVar11] == true)) {
        uVar10 = add(params,params->pool[uVar11]);
      }
      if (-1 < (int)uVar10) {
        bVar9 = update(params,(ulong)uVar10);
        subopt = calloc_or_throw<double>(model->num_support);
        if (params->reprocess != 0) {
          uVar20 = 0;
          do {
            if (model->num_support == 0) break;
            fVar22 = merand48(&params->all->random_state);
            if (0.5 <= fVar22) {
              sVar21 = suboptimality(model,subopt);
              if (0.0 < subopt[sVar21]) {
                if ((((!bVar9) && (uVar20 == 0)) && (sVar21 == uVar10)) && (sVar21 != 0)) {
                  pvVar4 = params->all;
                  pvVar18 = &pvVar4->trace_message;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&pvVar18->super_ostream,"Shouldn\'t reprocess right after process!!!",
                             0x2a);
                  cVar8 = (char)pvVar18;
                  std::ios::widen((char)(pvVar4->trace_message).super_ostream._vptr_basic_ostream
                                        [-3] + cVar8);
                  std::ostream::put(cVar8);
                  std::ostream::flush();
                }
                uVar13 = model->num_support * sVar21;
                if (uVar13 < params->maxcache || uVar13 - params->maxcache == 0) {
                  psVar5 = params->model;
                  uVar13 = psVar5->num_support;
                  if (uVar13 <= sVar21) {
                    pvVar18 = &params->all->trace_message;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pvVar18->super_ostream,"Internal error at ",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pvVar18->super_ostream,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
                               ,0x6b);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pvVar18->super_ostream,":",1);
                    plVar14 = (long *)std::ostream::operator<<(pvVar18,0x99);
                    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
                    std::ostream::put((char)plVar14);
                    std::ostream::flush();
                  }
                  psVar3 = (psVar5->support_vec)._begin[sVar21];
                  svm_example::compute_kernels(psVar3,params);
                  fVar22 = (psVar5->alpha)._begin[sVar21];
                  fVar24 = (psVar5->delta)._begin[sVar21];
                  for (sVar15 = sVar21; sVar15 != 0; sVar15 = sVar15 - 1) {
                    ppsVar6 = (psVar5->support_vec)._begin;
                    ppsVar6[sVar15] = ppsVar6[sVar15 - 1];
                    pfVar7 = (psVar5->alpha)._begin;
                    pfVar7[sVar15] = pfVar7[sVar15 - 1];
                    pfVar7 = (psVar5->delta)._begin;
                    pfVar7[sVar15] = pfVar7[sVar15 - 1];
                  }
                  *(psVar5->support_vec)._begin = psVar3;
                  *(psVar5->alpha)._begin = fVar22;
                  *(psVar5->delta)._begin = fVar24;
                  if (uVar13 != 0) {
                    uVar19 = 0;
                    do {
                      this = (psVar5->support_vec)._begin[uVar19];
                      pfVar7 = (this->krow)._begin;
                      if (sVar21 < (ulong)((long)(this->krow)._end - (long)pfVar7 >> 2)) {
                        fVar22 = pfVar7[sVar21];
                        for (sVar15 = sVar21; sVar15 != 0; sVar15 = sVar15 - 1) {
                          pfVar7 = (this->krow)._begin;
                          pfVar7[sVar15] = pfVar7[sVar15 - 1];
                        }
                      }
                      else {
                        fVar22 = (psVar3->krow)._begin[uVar19];
                        local_60._M_impl._0_4_ = 0;
                        v_array<float>::push_back(&this->krow,(float *)&local_60);
                        lVar17 = (long)(this->krow)._end - (long)(this->krow)._begin >> 2;
                        while (lVar16 = lVar17 + -1, lVar16 != 0) {
                          pfVar7 = (this->krow)._begin;
                          pfVar7[lVar16] = pfVar7[lVar17 + -2];
                          lVar17 = lVar16;
                        }
                      }
                      *(this->krow)._begin = fVar22;
                      uVar19 = uVar19 + 1;
                    } while (uVar19 != uVar13);
                  }
                }
                goto LAB_001e58c2;
              }
            }
            else {
              fVar22 = merand48(&params->all->random_state);
              fVar22 = floorf(fVar22 * (float)model->num_support);
              sVar21 = (long)(fVar22 - 9.223372e+18) & (long)fVar22 >> 0x3f | (long)fVar22;
LAB_001e58c2:
              update(params,sVar21);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < params->reprocess);
        }
        free(subopt);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < params->pool_pos);
  }
  free(scores);
  free(train_pool);
  return;
}

Assistant:

void train(svm_params& params)
{
  // params.all->opts_n_args.trace_message<<"In train "<<params.all->training<<endl;

  bool* train_pool = calloc_or_throw<bool>(params.pool_size);
  for (size_t i = 0; i < params.pool_size; i++) train_pool[i] = false;

  float* scores = calloc_or_throw<float>(params.pool_pos);
  predict(params, params.pool, scores, params.pool_pos);
  // cout<<scores[0]<<endl;

  if (params.active)
  {
    if (params.active_pool_greedy)
    {
      multimap<double, size_t> scoremap;
      for (size_t i = 0; i < params.pool_pos; i++)
        scoremap.insert(pair<const double, const size_t>(fabs(scores[i]), i));

      multimap<double, size_t>::iterator iter = scoremap.begin();
      // params.all->opts_n_args.trace_message<<params.pool_size<<" "<<"Scoremap: ";
      // for(;iter != scoremap.end();iter++)
      // params.all->opts_n_args.trace_message<<iter->first<<" "<<iter->second<<"
      // "<<((label_data*)params.pool[iter->second]->ld)->label<<"\t"; params.all->opts_n_args.trace_message<<endl;
      iter = scoremap.begin();

      for (size_t train_size = 1; iter != scoremap.end() && train_size <= params.subsample; train_size++)
      {
        // params.all->opts_n_args.trace_message<<train_size<<" "<<iter->second<<" "<<iter->first<<endl;
        train_pool[iter->second] = 1;
        iter++;
      }
    }
    else
    {
      for (size_t i = 0; i < params.pool_pos; i++)
      {
        float queryp = 2.0f /
            (1.0f +
                expf(
                    (float)(params.active_c * fabs(scores[i])) * (float)pow(params.pool[i]->ex.example_counter, 0.5f)));
        if (merand48(params.all->random_state) < queryp)
        {
          svm_example* fec = params.pool[i];
          fec->ex.l.simple.weight *= 1 / queryp;
          train_pool[i] = 1;
        }
      }
    }
    // free(scores);
  }

  if (params.para_active)
  {
    for (size_t i = 0; i < params.pool_pos; i++)
      if (!train_pool[i])
        delete params.pool[i];
    sync_queries(*(params.all), params, train_pool);
  }

  if (params.all->training)
  {
    svm_model* model = params.model;

    for (size_t i = 0; i < params.pool_pos; i++)
    {
      // params.all->opts_n_args.trace_message<<"process: "<<i<<" "<<train_pool[i]<<endl;;
      int model_pos = -1;
      if (params.active)
      {
        if (train_pool[i])
        {
          // params.all->opts_n_args.trace_message<<"i = "<<i<<"train_pool[i] = "<<train_pool[i]<<"
          // "<<params.pool[i]->example_counter<<endl;
          model_pos = add(params, params.pool[i]);
        }
      }
      else
        model_pos = add(params, params.pool[i]);

      // params.all->opts_n_args.trace_message<<"Added: "<<model_pos<<"
      // "<<model->support_vec[model_pos]->example_counter<<endl; cout<<"After adding in train
      // "<<model->num_support<<endl;

      if (model_pos >= 0)
      {
        bool overshoot = update(params, model_pos);
        // cout<<model_pos<<":alpha = "<<model->alpha[model_pos]<<endl;

        double* subopt = calloc_or_throw<double>(model->num_support);
        for (size_t j = 0; j < params.reprocess; j++)
        {
          if (model->num_support == 0)
            break;
          // cout<<"reprocess: ";
          int randi = 1;
          if (merand48(params.all->random_state) < 0.5)
            randi = 0;
          if (randi)
          {
            size_t max_pos = suboptimality(model, subopt);
            if (subopt[max_pos] > 0)
            {
              if (!overshoot && max_pos == (size_t)model_pos && max_pos > 0 && j == 0)
                params.all->trace_message << "Shouldn't reprocess right after process!!!" << endl;
              // cout<<max_pos<<" "<<subopt[max_pos]<<endl;
              // cout<<params.model->support_vec[0]->example_counter<<endl;
              if (max_pos * model->num_support <= params.maxcache)
                make_hot_sv(params, max_pos);
              update(params, max_pos);
            }
          }
          else
          {
            size_t rand_pos = (size_t)floorf(merand48(params.all->random_state) * model->num_support);
            update(params, rand_pos);
          }
        }
        // cout<<endl;
        // cout<<params.model->support_vec[0]->example_counter<<endl;
        free(subopt);
      }
    }
  }
  else
    for (size_t i = 0; i < params.pool_pos; i++) delete params.pool[i];

  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  // for(int i = 0;i < params.pool_size;i++)
  //   params.all->opts_n_args.trace_message<<scores[i]<<" ";
  // params.all->opts_n_args.trace_message<<endl;
  free(scores);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  free(train_pool);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
}